

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O2

void __thiscall
DigitalConsumer::DigitalConsumer
          (DigitalConsumer *this,HighFreqDataType *hf,int ringbufsize,HFParsingInfo *parseargs)

{
  int iVar1;
  allocator_type local_b9;
  HighFreqDataType local_b8;
  
  HighFreqDataType::HighFreqDataType(&local_b8,hf);
  HFSubConsumer::HFSubConsumer
            (&this->super_HFSubConsumer,&local_b8,(long)ringbufsize,digital_queue_filter);
  HighFreqDataType::~HighFreqDataType(&local_b8);
  (this->super_HFSubConsumer).super_HighFreqSub._vptr_HighFreqSub =
       (_func_int **)&PTR__DigitalConsumer_002fa2e8;
  (this->digital_mask).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->digital_mask).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->digital_mask).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->prev_digital).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->prev_digital).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->prev_digital).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = HighFreqDataType::getByteSize(hf);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->temp_buffer,(long)iVar1,&local_b9);
  HFParsingInfo::HFParsingInfo(&this->args,parseargs);
  (this->super_HFSubConsumer).super_HighFreqSub.sockType = ST_FILTERED_CONSUMER;
  return;
}

Assistant:

DigitalConsumer::DigitalConsumer(HighFreqDataType hf, int ringbufsize, HFParsingInfo parseargs)
    : HFSubConsumer(hf, ringbufsize, digital_queue_filter),
      temp_buffer(hf.getByteSize()),
      args(parseargs)
{
    sockType = ST_FILTERED_CONSUMER;
}